

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[4]>(XmlWriter *this,string *name,char (*attribute) [4])

{
  tuple<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar1;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar2;
  size_t sVar3;
  size_t sVar4;
  ReusableStringStream rss;
  ReusableStringStream local_58;
  string local_40;
  
  local_58.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001bd9c8;
  pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar3 = StringStreams::add(&pSVar2->super_StringStreams);
  local_58.m_index = sVar3;
  pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  tVar1.
  super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       *(_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&(pSVar2->super_StringStreams).m_streams.
            super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar3]._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  local_58.m_oss =
       (ostream *)
       tVar1.
       super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  sVar4 = strlen(*attribute);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             tVar1.
             super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,*attribute,sVar4);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_58);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }